

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QRingChunk>::eraseLast(QGenericArrayOps<QRingChunk> *this)

{
  qsizetype *pqVar1;
  
  QArrayDataPointer<char>::~QArrayDataPointer
            ((QArrayDataPointer<char> *)
             ((this->super_QArrayDataPointer<QRingChunk>).ptr +
             (this->super_QArrayDataPointer<QRingChunk>).size + -1));
  pqVar1 = &(this->super_QArrayDataPointer<QRingChunk>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }